

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsa.c
# Opt level: O2

int mbedtls_rsa_rsassa_pss_verify_ext
              (mbedtls_rsa_context *ctx,_func_int_void_ptr_uchar_ptr_size_t *f_rng,void *p_rng,
              int mode,mbedtls_md_type_t md_alg,uint hashlen,uchar *hash,
              mbedtls_md_type_t mgf1_hash_id,int expected_salt_len,uchar *sig)

{
  uchar uVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  mbedtls_md_info_t *pmVar5;
  size_t sVar6;
  ulong slen;
  size_t sVar7;
  uchar *dst;
  uchar *puVar8;
  uchar *input;
  ulong uVar9;
  bool bVar10;
  mbedtls_md_context_t md_ctx;
  uchar zeros [8];
  uchar result [64];
  uchar buf [1024];
  
  if ((mode == 1) && (ctx->padding != 1)) {
    return -0x4080;
  }
  sVar7 = ctx->len;
  if (0xfffffffffffffc0e < sVar7 - 0x401) {
    if (mode == 0) {
      iVar3 = mbedtls_rsa_public(ctx,sig,buf);
    }
    else {
      iVar3 = mbedtls_rsa_private(ctx,f_rng,p_rng,sig,buf);
    }
    if (iVar3 != 0) {
      return iVar3;
    }
    if (result[sVar7 + 0x3f] != 0xbc) {
      return -0x4100;
    }
    if (md_alg != MBEDTLS_MD_NONE) {
      pmVar5 = mbedtls_md_info_from_type(md_alg);
      if (pmVar5 == (mbedtls_md_info_t *)0x0) {
        return -0x4080;
      }
      bVar2 = mbedtls_md_get_size(pmVar5);
      hashlen = (uint)bVar2;
    }
    pmVar5 = mbedtls_md_info_from_type(mgf1_hash_id);
    if (pmVar5 != (mbedtls_md_info_t *)0x0) {
      bVar2 = mbedtls_md_get_size(pmVar5);
      zeros[0] = '\0';
      zeros[1] = '\0';
      zeros[2] = '\0';
      zeros[3] = '\0';
      zeros[4] = '\0';
      zeros[5] = '\0';
      zeros[6] = '\0';
      zeros[7] = '\0';
      sVar6 = mbedtls_mpi_bitlen(&ctx->N);
      if (buf[0] >> ((char)sVar6 + (char)sVar7 * -8 + 7U & 0x1f) == 0) {
        slen = (ulong)bVar2;
        bVar10 = (sVar6 - 1 & 7) == 0;
        uVar9 = sVar7 - 1;
        if (!bVar10) {
          uVar9 = sVar7;
        }
        if (uVar9 < slen + 2) {
          return -0x4080;
        }
        mbedtls_md_init(&md_ctx);
        iVar3 = mbedtls_md_setup(&md_ctx,pmVar5,0);
        if (iVar3 == 0) {
          dst = buf + bVar10;
          sVar7 = ~slen + uVar9;
          iVar3 = mgf_mask(dst,sVar7,dst + (uVar9 - slen) + -1,slen,&md_ctx);
          if (iVar3 == 0) {
            buf[0] = buf[0] & (byte)(0xff >> ((char)uVar9 * '\b' - (char)(sVar6 - 1) & 0x1fU));
            puVar8 = dst;
            do {
              uVar1 = *puVar8;
              input = puVar8 + 1;
              sVar7 = sVar7 - 1;
              if (dst + (uVar9 - slen) + -2 <= puVar8) break;
              puVar8 = input;
            } while (uVar1 == '\0');
            iVar3 = -0x4100;
            if ((((uVar1 == '\x01') &&
                 (((expected_salt_len == -1 || ((long)expected_salt_len == sVar7)) &&
                  (iVar3 = mbedtls_md_starts(&md_ctx), iVar3 == 0)))) &&
                (((iVar3 = mbedtls_md_update(&md_ctx,zeros,8), iVar3 == 0 &&
                  (iVar3 = mbedtls_md_update(&md_ctx,hash,(ulong)hashlen), iVar3 == 0)) &&
                 (iVar3 = mbedtls_md_update(&md_ctx,input,sVar7), iVar3 == 0)))) &&
               (iVar3 = mbedtls_md_finish(&md_ctx,result), iVar3 == 0)) {
              iVar4 = bcmp(dst + (uVar9 - slen) + -1,result,slen);
              iVar3 = -0x4380;
              if (iVar4 == 0) {
                iVar3 = 0;
              }
            }
          }
        }
        mbedtls_md_free(&md_ctx);
        return iVar3;
      }
    }
  }
  return -0x4080;
}

Assistant:

int mbedtls_rsa_rsassa_pss_verify_ext( mbedtls_rsa_context *ctx,
                               int (*f_rng)(void *, unsigned char *, size_t),
                               void *p_rng,
                               int mode,
                               mbedtls_md_type_t md_alg,
                               unsigned int hashlen,
                               const unsigned char *hash,
                               mbedtls_md_type_t mgf1_hash_id,
                               int expected_salt_len,
                               const unsigned char *sig )
{
    int ret = MBEDTLS_ERR_ERROR_CORRUPTION_DETECTED;
    size_t siglen;
    unsigned char *p;
    unsigned char *hash_start;
    unsigned char result[MBEDTLS_MD_MAX_SIZE];
    unsigned char zeros[8];
    unsigned int hlen;
    size_t observed_salt_len, msb;
    const mbedtls_md_info_t *md_info;
    mbedtls_md_context_t md_ctx;
    unsigned char buf[MBEDTLS_MPI_MAX_SIZE];

    RSA_VALIDATE_RET( ctx != NULL );
    RSA_VALIDATE_RET( mode == MBEDTLS_RSA_PRIVATE ||
                      mode == MBEDTLS_RSA_PUBLIC );
    RSA_VALIDATE_RET( sig != NULL );
    RSA_VALIDATE_RET( ( md_alg  == MBEDTLS_MD_NONE &&
                        hashlen == 0 ) ||
                      hash != NULL );

    if( mode == MBEDTLS_RSA_PRIVATE && ctx->padding != MBEDTLS_RSA_PKCS_V21 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    siglen = ctx->len;

    if( siglen < 16 || siglen > sizeof( buf ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    ret = ( mode == MBEDTLS_RSA_PUBLIC )
          ? mbedtls_rsa_public(  ctx, sig, buf )
          : mbedtls_rsa_private( ctx, f_rng, p_rng, sig, buf );

    if( ret != 0 )
        return( ret );

    p = buf;

    if( buf[siglen - 1] != 0xBC )
        return( MBEDTLS_ERR_RSA_INVALID_PADDING );

    if( md_alg != MBEDTLS_MD_NONE )
    {
        /* Gather length of hash to sign */
        md_info = mbedtls_md_info_from_type( md_alg );
        if( md_info == NULL )
            return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

        hashlen = mbedtls_md_get_size( md_info );
    }

    md_info = mbedtls_md_info_from_type( mgf1_hash_id );
    if( md_info == NULL )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    hlen = mbedtls_md_get_size( md_info );

    memset( zeros, 0, 8 );

    /*
     * Note: EMSA-PSS verification is over the length of N - 1 bits
     */
    msb = mbedtls_mpi_bitlen( &ctx->N ) - 1;

    if( buf[0] >> ( 8 - siglen * 8 + msb ) )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );

    /* Compensate for boundary condition when applying mask */
    if( msb % 8 == 0 )
    {
        p++;
        siglen -= 1;
    }

    if( siglen < hlen + 2 )
        return( MBEDTLS_ERR_RSA_BAD_INPUT_DATA );
    hash_start = p + siglen - hlen - 1;

    mbedtls_md_init( &md_ctx );
    if( ( ret = mbedtls_md_setup( &md_ctx, md_info, 0 ) ) != 0 )
        goto exit;

    ret = mgf_mask( p, siglen - hlen - 1, hash_start, hlen, &md_ctx );
    if( ret != 0 )
        goto exit;

    buf[0] &= 0xFF >> ( siglen * 8 - msb );

    while( p < hash_start - 1 && *p == 0 )
        p++;

    if( *p++ != 0x01 )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    observed_salt_len = hash_start - p;

    if( expected_salt_len != MBEDTLS_RSA_SALT_LEN_ANY &&
        observed_salt_len != (size_t) expected_salt_len )
    {
        ret = MBEDTLS_ERR_RSA_INVALID_PADDING;
        goto exit;
    }

    /*
     * Generate H = Hash( M' )
     */
    ret = mbedtls_md_starts( &md_ctx );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, zeros, 8 );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, hash, hashlen );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_update( &md_ctx, p, observed_salt_len );
    if ( ret != 0 )
        goto exit;
    ret = mbedtls_md_finish( &md_ctx, result );
    if ( ret != 0 )
        goto exit;

    if( memcmp( hash_start, result, hlen ) != 0 )
    {
        ret = MBEDTLS_ERR_RSA_VERIFY_FAILED;
        goto exit;
    }

exit:
    mbedtls_md_free( &md_ctx );

    return( ret );
}